

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_dht_port(bt_peer_connection *this,int received)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcStack_48;
  int listen_port;
  char *ptr;
  span<const_char> recv_buffer;
  error_code local_28;
  int local_14;
  bt_peer_connection *pbStack_10;
  int received_local;
  bt_peer_connection *this_local;
  
  local_14 = received;
  pbStack_10 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar3 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
  if (iVar3 == 3) {
    bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
    if (bVar1) {
      _ptr = crypto_receive_buffer::get(&this->m_recv_buffer);
      pcStack_48 = span<const_char>::data((span<const_char> *)&ptr);
      pcStack_48 = pcStack_48 + 1;
      uVar2 = read_uint16<char_const*>(&stack0xffffffffffffffb8);
      peer_connection::incoming_dht_port(&this->super_peer_connection,(uint)uVar2);
      if ((((byte)(this->super_peer_connection).field_0x889 >> 1 & 1) == 0) &&
         ((this->super_peer_connection).field_0x889 =
               (this->super_peer_connection).field_0x889 & 0xfd | 2,
         ((byte)(this->super_peer_connection).field_0x889 >> 3 & 1) != 0)) {
        write_dht_port(this);
      }
    }
  }
  else {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_28,invalid_dht_port,(type *)0x0);
    recv_buffer.m_len._7_1_ = 2;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_28,1,2);
  }
  return;
}

Assistant:

void bt_peer_connection::on_dht_port(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() != 3)
		{
			disconnect(errors::invalid_dht_port, operation_t::bittorrent, peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		const char* ptr = recv_buffer.data() + 1;
		int const listen_port = aux::read_uint16(ptr);

		incoming_dht_port(listen_port);

		if (!m_supports_dht_port)
		{
			m_supports_dht_port = true;
			// if we're done with the handshake, respond right away, otherwise
			// we'll send the DHT port later
			if (m_sent_bitfield)
				write_dht_port();
		}
	}